

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_palette_add(LodePNGColorMode *info,uchar r,uchar g,uchar b,uchar a)

{
  void *pvVar1;
  undefined1 in_CL;
  undefined1 in_DL;
  undefined1 in_SIL;
  long in_RDI;
  undefined1 in_R8B;
  uchar *data;
  size_t in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 8) == 0) {
    pvVar1 = lodepng_realloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (pvVar1 == (void *)0x0) {
      return 0x53;
    }
    *(void **)(in_RDI + 8) = pvVar1;
  }
  *(undefined1 *)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10) * 4) = in_SIL;
  *(undefined1 *)(*(long *)(in_RDI + 8) + 1 + *(long *)(in_RDI + 0x10) * 4) = in_DL;
  *(undefined1 *)(*(long *)(in_RDI + 8) + 2 + *(long *)(in_RDI + 0x10) * 4) = in_CL;
  *(undefined1 *)(*(long *)(in_RDI + 8) + 3 + *(long *)(in_RDI + 0x10) * 4) = in_R8B;
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
  return 0;
}

Assistant:

unsigned lodepng_palette_add(LodePNGColorMode* info,
                             unsigned char r, unsigned char g, unsigned char b, unsigned char a)
{
  unsigned char* data;
  /*the same resize technique as C++ std::vectors is used, and here it's made so that for a palette with
  the max of 256 colors, it'll have the exact alloc size*/
  if(!info->palette) /*allocate palette if empty*/
  {
    /*room for 256 colors with 4 bytes each*/
    data = (unsigned char*)lodepng_realloc(info->palette, 1024);
    if(!data) return 83; /*alloc fail*/
    else info->palette = data;
  }
  info->palette[4 * info->palettesize + 0] = r;
  info->palette[4 * info->palettesize + 1] = g;
  info->palette[4 * info->palettesize + 2] = b;
  info->palette[4 * info->palettesize + 3] = a;
  ++info->palettesize;
  return 0;
}